

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O0

void __thiscall PKCS12Test_TestUnicode_Test::TestBody(PKCS12Test_TestUnicode_Test *this)

{
  undefined1 auVar1 [16];
  Span<const_unsigned_char> der;
  string_view s;
  undefined1 local_30 [8];
  string data;
  PKCS12Test_TestUnicode_Test *this_local;
  
  data.field_2._8_8_ = this;
  GetTestData_abi_cxx11_((string *)local_30,"crypto/pkcs8/test/unicode_password.p12");
  auVar1 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
  s._M_str = auVar1._8_8_;
  s._M_len = (size_t)s._M_str;
  der = bssl::StringAsBytes(auVar1._0_8_,s);
  TestImpl("Unicode",der,kUnicodePassword,(char *)0x0);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(PKCS12Test, TestUnicode) {
  // Generated with
  //   openssl pkcs12 -export -inkey ecdsa_p256_key.pem -in ecdsa_p256_cert.pem -password pass:"Hello, 世界"
  std::string data = GetTestData("crypto/pkcs8/test/unicode_password.p12");
  TestImpl("Unicode", bssl::StringAsBytes(data), kUnicodePassword, nullptr);
}